

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  huff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  char *bufstart;
  int symbol;
  int iVar12;
  ulong uVar13;
  int absvalues [64];
  
  entropy = (huff_entropy_ptr)cinfo->entropy;
  pjVar4 = cinfo->dest;
  entropy->next_output_byte = pjVar4->next_output_byte;
  entropy->free_in_buffer = pjVar4->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar2 = cinfo->Se;
  iVar12 = cinfo->Al;
  piVar5 = cinfo->natural_order;
  paJVar6 = *MCU_data;
  uVar8 = 0;
  uVar13 = (ulong)cinfo->Ss;
  for (uVar9 = uVar13; (long)uVar9 <= (long)iVar2; uVar9 = uVar9 + 1) {
    uVar1 = (*paJVar6)[piVar5[uVar9]];
    uVar11 = -uVar1;
    if (0 < (short)uVar1) {
      uVar11 = uVar1;
    }
    uVar10 = (uint)(uVar11 >> ((byte)iVar12 & 0x1f));
    absvalues[uVar9] = uVar10;
    if (uVar10 == 1) {
      uVar8 = uVar9 & 0xffffffff;
    }
  }
  bufstart = entropy->bit_buffer + entropy->BE;
  uVar10 = 0;
  iVar12 = 0;
  for (; (long)uVar13 <= (long)iVar2; uVar13 = uVar13 + 1) {
    iVar3 = absvalues[uVar13];
    if (iVar3 == 0) {
      iVar12 = iVar12 + 1;
    }
    else {
      symbol = iVar12 * 0x10 + 1;
      while ((0xf < iVar12 && ((long)uVar13 <= (long)(int)uVar8))) {
        emit_eobrun(entropy);
        emit_ac_symbol(entropy,entropy->ac_tbl_no,0xf0);
        iVar12 = iVar12 + -0x10;
        emit_buffered_bits(entropy,bufstart,uVar10);
        bufstart = entropy->bit_buffer;
        symbol = symbol + -0x100;
        uVar10 = 0;
      }
      if (iVar3 < 2) {
        emit_eobrun(entropy);
        emit_ac_symbol(entropy,entropy->ac_tbl_no,symbol);
        emit_bits_e(entropy,(uint)(-1 < (*paJVar6)[piVar5[uVar13]]),1);
        emit_buffered_bits(entropy,bufstart,uVar10);
        bufstart = entropy->bit_buffer;
        uVar10 = 0;
        iVar12 = 0;
      }
      else {
        uVar9 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        bufstart[uVar9] = (byte)iVar3 & 1;
      }
    }
  }
  if (uVar10 != 0 || 0 < iVar12) {
    uVar7 = entropy->EOBRUN + 1;
    entropy->EOBRUN = uVar7;
    uVar10 = uVar10 + entropy->BE;
    entropy->BE = uVar10;
    if ((uVar7 == 0x7fff) || (0x3a9 < uVar10)) {
      emit_eobrun(entropy);
    }
  }
  pjVar4 = cinfo->dest;
  pjVar4->next_output_byte = entropy->next_output_byte;
  pjVar4->free_in_buffer = entropy->free_in_buffer;
  uVar10 = cinfo->restart_interval;
  if (uVar10 != 0) {
    uVar7 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar7 = uVar10;
    }
    entropy->restarts_to_go = uVar7 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);	/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 0);
	  }
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 1);
	  }
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}